

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix33<float> * __thiscall
Imath_3_2::Matrix33<float>::shear<float>(Matrix33<float> *this,float *xy)

{
  float *xy_local;
  Matrix33<float> *this_local;
  
  this->x[1][0] = *xy * this->x[0][0] + this->x[1][0];
  this->x[1][1] = *xy * this->x[0][1] + this->x[1][1];
  this->x[1][2] = *xy * this->x[0][2] + this->x[1][2];
  return this;
}

Assistant:

const Matrix33<T>&
                 Matrix33<T>::shear (const S& xy) IMATH_NOEXCEPT
{
    //
    // In this case, we don't need a temp. copy of the matrix
    // because we never use a value on the RHS after we've
    // changed it on the LHS.
    //

    x[1][0] += xy * x[0][0];
    x[1][1] += xy * x[0][1];
    x[1][2] += xy * x[0][2];

    return *this;
}